

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraRay> * __thiscall
pbrt::OrthographicCamera::GenerateRay
          (OrthographicCamera *this,CameraSample sample,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_float> t;
  Vector3f d;
  Point3<float> p;
  undefined8 in_RSI;
  CameraBase *in_RDI;
  Float FVar1;
  undefined1 auVar8 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar7 [64];
  Point3<float> PVar9;
  Point3f PVar10;
  Vector3<float> VVar11;
  Point3f pFocus;
  Float ft;
  Point2f pLens;
  Ray ray;
  Point3f pCamera;
  Point3f pFilm;
  float in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe0c;
  CameraBase *this_00;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffe30;
  float fVar13;
  undefined4 uStack_1c4;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffe48;
  float in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  Float in_stack_fffffffffffffe5c;
  float in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  Transform *in_stack_ffffffffffffff98;
  undefined8 local_24;
  float local_1c;
  undefined1 auVar2 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  uVar12 = (undefined4)((ulong)&stack0x00000008 >> 0x20);
  fVar13 = (float)in_RSI;
  uStack_1c4 = (undefined4)((ulong)in_RSI >> 0x20);
  this_00 = in_RDI;
  Point3<float>::Point3
            ((Point3<float> *)in_RDI,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,0.0);
  auVar8 = ZEXT856(0);
  PVar9.super_Tuple3<pbrt::Point3,_float>.z = local_1c;
  PVar9.super_Tuple3<pbrt::Point3,_float>._0_8_ = local_24;
  PVar9 = Transform::operator()(in_stack_ffffffffffffff98,PVar9);
  auVar2._0_8_ = PVar9.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar8;
  vmovlpd_avx(auVar2._0_16_);
  Vector3<float>::Vector3
            ((Vector3<float> *)in_RDI,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,0.0);
  FVar1 = CameraBase::SampleTime(in_RDI,in_stack_fffffffffffffe0c);
  Medium::Medium((Medium *)in_RDI,
                 (Medium *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  PVar10.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffe50;
  PVar10.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffffe48.x;
  PVar10.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffffe48.y;
  d.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffe30;
  d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar12;
  d.super_Tuple3<pbrt::Vector3,_float>.z = FVar1;
  Ray::Ray((Ray *)in_RDI,PVar10,d,in_stack_fffffffffffffe0c,(Medium *)0x852244);
  if (0.0 < *(float *)(CONCAT44(uStack_1c4,fVar13) + 0x580)) {
    in_stack_fffffffffffffe0c = *(float *)(CONCAT44(uStack_1c4,fVar13) + 0x580);
    auVar3._0_8_ = SampleUniformDiskConcentric(in_stack_fffffffffffffe48);
    auVar3._8_56_ = extraout_var;
    vmovlpd_avx(auVar3._0_16_);
    t.y = in_stack_fffffffffffffe0c;
    t.x = in_stack_fffffffffffffe08;
    auVar4._0_8_ = pbrt::operator*(0.0,t);
    auVar4._8_56_ = extraout_var_00;
    vmovlpd_avx(auVar4._0_16_);
    auVar8 = (undefined1  [56])0x0;
    PVar10 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             in_stack_fffffffffffffe5c);
    auVar5._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar5._8_56_ = auVar8;
    vmovlpd_avx(auVar5._0_16_);
    Point3<float>::Point3
              ((Point3<float> *)in_RDI,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,0.0);
    auVar8 = ZEXT856(0);
    p.super_Tuple3<pbrt::Point3,_float>.y = FVar1;
    p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffe30;
    p.super_Tuple3<pbrt::Point3,_float>.z = fVar13;
    VVar11 = Point3<float>::operator-((Point3<float> *)this_00,p);
    auVar6._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar8;
    vmovlpd_avx(auVar6._0_16_);
    auVar8 = ZEXT856(0);
    VVar11.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffe5c;
    VVar11.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe58;
    VVar11.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe60;
    VVar11 = Normalize<float>(VVar11);
    auVar7._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar8;
    vmovlpd_avx(auVar7._0_16_);
  }
  CameraBase::RenderFromCamera(this_00,(Ray *)in_RDI);
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)in_RDI,in_stack_fffffffffffffe0c);
  pstd::optional<pbrt::CameraRay>::optional
            ((optional<pbrt::CameraRay> *)in_RDI,
             (CameraRay *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  return (optional<pbrt::CameraRay> *)this_00;
}

Assistant:

PBRT_CPU_GPU pstd::optional<CameraRay> OrthographicCamera::GenerateRay(
    CameraSample sample, SampledWavelengths &lambda) const {
    // Compute raster and camera sample positions
    Point3f pFilm = Point3f(sample.pFilm.x, sample.pFilm.y, 0);
    Point3f pCamera = cameraFromRaster(pFilm);

    Ray ray(pCamera, Vector3f(0, 0, 1), SampleTime(sample.time), medium);
    // Modify ray for depth of field
    if (lensRadius > 0) {
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute point on plane of focus
        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = ray(ft);

        // Update ray for effect of lens
        ray.o = Point3f(pLens.x, pLens.y, 0);
        ray.d = Normalize(pFocus - ray.o);
    }

    return CameraRay{RenderFromCamera(ray)};
}